

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O1

bool google::protobuf::internal::anon_unknown_15::UnknownFieldHandlerLite::Skip
               (MessageLite *msg,ParseTable *table,CodedInputStream *input,int tag)

{
  ulong uVar1;
  bool bVar2;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  LogMessage local_d0;
  undefined1 local_98 [8];
  StringOutputStream unknown_fields_string;
  CodedOutputStream unknown_fields_stream;
  
  if (table->unknown_field_set == true) {
    LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_table_driven_lite.cc"
               ,0x3a);
    other = LogMessage::operator<<(&local_d0,"CHECK failed: !table.unknown_field_set: ");
    LogFinisher::operator=((LogFinisher *)&unknown_fields_string.target_,other);
    LogMessage::~LogMessage(&local_d0);
  }
  uVar1 = *(ulong *)((long)&msg->_vptr_MessageLite + table->arena_offset);
  if ((uVar1 & 1) == 0) {
    target = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                       ((InternalMetadata *)((long)&msg->_vptr_MessageLite + table->arena_offset));
  }
  else {
    target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((uVar1 & 0xfffffffffffffffe) + 8);
  }
  io::StringOutputStream::StringOutputStream((StringOutputStream *)local_98,target);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)&unknown_fields_string.target_,(ZeroCopyOutputStream *)local_98,
             false);
  bVar2 = WireFormatLite::SkipField(input,tag,(CodedOutputStream *)&unknown_fields_string.target_);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&unknown_fields_string.target_);
  return bVar2;
}

Assistant:

static bool Skip(MessageLite* msg, const ParseTable& table,
                   io::CodedInputStream* input, int tag) {
    GOOGLE_DCHECK(!table.unknown_field_set);
    io::StringOutputStream unknown_fields_string(
        MutableUnknownFields(msg, table.arena_offset));
    io::CodedOutputStream unknown_fields_stream(&unknown_fields_string, false);

    return internal::WireFormatLite::SkipField(input, tag,
                                               &unknown_fields_stream);
  }